

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

int emptybuffer(luaL_Buffer *B)

{
  size_t len;
  size_t l;
  luaL_Buffer *B_local;
  
  len = (long)B->p - (long)B->buffer;
  if (len != 0) {
    lua_pushlstring(B->L,B->buffer,len);
    B->p = B->buffer;
    B->lvl = B->lvl + 1;
  }
  B_local._4_4_ = (uint)(len != 0);
  return B_local._4_4_;
}

Assistant:

static int emptybuffer(luaL_Buffer *B)
{
  size_t l = bufflen(B);
  if (l == 0)
    return 0;  /* put nothing on stack */
  lua_pushlstring(B->L, B->buffer, l);
  B->p = B->buffer;
  B->lvl++;
  return 1;
}